

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ssize_t __thiscall hdc::Parser::read(Parser *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  SourceFile *pSVar2;
  iterator iVar3;
  Import *import;
  Def *def;
  Class *klass;
  GlobalVariable *var;
  GlobalConstant *var_00;
  Struct *s;
  undefined4 in_register_00000034;
  string *path;
  string local_1a8 [32];
  vector<hdc::Token,_std::allocator<hdc::Token>_> local_188;
  undefined1 local_170 [8];
  Lex lex;
  string *path_local;
  Parser *this_local;
  
  path = (string *)CONCAT44(in_register_00000034,__fd);
  lex.operatorMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)path;
  Lex::Lex((Lex *)local_170);
  std::__cxx11::string::string(local_1a8,path);
  Lex::getTokens(&local_188,(Lex *)local_170,(string *)local_1a8);
  std::vector<hdc::Token,_std::allocator<hdc::Token>_>::operator=(&this->tokens,&local_188);
  std::vector<hdc::Token,_std::allocator<hdc::Token>_>::~vector(&local_188);
  std::__cxx11::string::~string(local_1a8);
  pSVar2 = (SourceFile *)operator_new(0xd0);
  SourceFile::SourceFile(pSVar2,(string *)path);
  this->file = pSVar2;
  iVar3 = std::vector<hdc::Token,_std::allocator<hdc::Token>_>::begin(&this->tokens);
  (this->current_token)._M_current = iVar3._M_current;
  std::__cxx11::string::operator=((string *)&this->filePath,path);
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while (bVar1 = lookahead(this,TK_IMPORT), bVar1) {
              pSVar2 = this->file;
              import = parse_import(this);
              SourceFile::addImport(pSVar2,import);
            }
            bVar1 = lookahead(this,TK_DEF);
            if (!bVar1) break;
            pSVar2 = this->file;
            def = parse_def(this);
            SourceFile::addDef(pSVar2,def);
          }
          bVar1 = lookahead(this,TK_CLASS);
          if (!bVar1) break;
          pSVar2 = this->file;
          klass = parse_class(this);
          SourceFile::addClass(pSVar2,klass);
        }
        bVar1 = lookahead(this,TK_VAR);
        if (!bVar1) break;
        pSVar2 = this->file;
        var = parse_global_variable(this);
        SourceFile::addGlobalVariable(pSVar2,var);
      }
      bVar1 = lookahead(this,TK_CONSTANT);
      if (!bVar1) break;
      pSVar2 = this->file;
      var_00 = parse_global_constant(this);
      SourceFile::addGlobalConstant(pSVar2,var_00);
    }
    bVar1 = lookahead(this,TK_STRUCT);
    if (!bVar1) break;
    pSVar2 = this->file;
    s = parse_struct(this);
    SourceFile::addStruct(pSVar2,s);
  }
  pSVar2 = this->file;
  Lex::~Lex((Lex *)local_170);
  return (ssize_t)pSVar2;
}

Assistant:

SourceFile* Parser::read(std::string path) {
    Lex lex;

    tokens = lex.getTokens(path);
    file = new SourceFile(path);
    current_token = tokens.begin();
    filePath = path;

    while (true) { 
        if (lookahead(TK_IMPORT)) {
            file->addImport(parse_import());
        } else if (lookahead(TK_DEF)) {
            file->addDef(parse_def());
        } else if (lookahead(TK_CLASS)) {
            file->addClass(parse_class());
        } else if (lookahead(TK_VAR)) {
            file->addGlobalVariable(parse_global_variable());
        } else if (lookahead(TK_CONSTANT)) {
            file->addGlobalConstant(parse_global_constant());
        } else if (lookahead(TK_STRUCT)) {
            file->addStruct(parse_struct());
        } else {
            break;
        }
    }

    return file;
}